

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<float,int>(Thread *this,UnopFunc<float,_int> *f)

{
  Simd<int,_(unsigned_char)__x04_> val;
  SR result;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  
  local_38.v128_.v = (v128)Pop(this);
  std::transform<int*,float*,float(*)(int)>
            ((int *)&local_38.i32_,(int *)&local_28.i32_,(float *)&local_28.f32_,f);
  Push(this,(Value)local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}